

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PackageExportAllDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PackageExportAllDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  TokenKind TVar22;
  undefined1 uVar23;
  NumericTokenFlags NVar24;
  uint32_t uVar25;
  PackageExportAllDeclarationSyntax *this_00;
  
  this_00 = (PackageExportAllDeclarationSyntax *)allocate(this,0x90,8);
  TVar6 = args_1->kind;
  uVar7 = args_1->field_0x2;
  NVar8.raw = (args_1->numFlags).raw;
  uVar9 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar10 = args_2->kind;
  uVar11 = args_2->field_0x2;
  NVar12.raw = (args_2->numFlags).raw;
  uVar13 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar14 = args_3->kind;
  uVar15 = args_3->field_0x2;
  NVar16.raw = (args_3->numFlags).raw;
  uVar17 = args_3->rawLen;
  pIVar3 = args_3->info;
  TVar18 = args_4->kind;
  uVar19 = args_4->field_0x2;
  NVar20.raw = (args_4->numFlags).raw;
  uVar21 = args_4->rawLen;
  pIVar4 = args_4->info;
  TVar22 = args_5->kind;
  uVar23 = args_5->field_0x2;
  NVar24.raw = (args_5->numFlags).raw;
  uVar25 = args_5->rawLen;
  pIVar5 = args_5->info;
  slang::syntax::MemberSyntax::MemberSyntax
            ((MemberSyntax *)this_00,PackageExportAllDeclaration,args);
  (this_00->keyword).kind = TVar6;
  (this_00->keyword).field_0x2 = uVar7;
  (this_00->keyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (this_00->keyword).rawLen = uVar9;
  (this_00->keyword).info = pIVar1;
  (this_00->star1).kind = TVar10;
  (this_00->star1).field_0x2 = uVar11;
  (this_00->star1).numFlags = (NumericTokenFlags)NVar12.raw;
  (this_00->star1).rawLen = uVar13;
  (this_00->star1).info = pIVar2;
  (this_00->doubleColon).kind = TVar14;
  (this_00->doubleColon).field_0x2 = uVar15;
  (this_00->doubleColon).numFlags = (NumericTokenFlags)NVar16.raw;
  (this_00->doubleColon).rawLen = uVar17;
  (this_00->doubleColon).info = pIVar3;
  (this_00->star2).kind = TVar18;
  (this_00->star2).field_0x2 = uVar19;
  (this_00->star2).numFlags = (NumericTokenFlags)NVar20.raw;
  (this_00->star2).rawLen = uVar21;
  (this_00->star2).info = pIVar4;
  (this_00->semi).kind = TVar22;
  (this_00->semi).field_0x2 = uVar23;
  (this_00->semi).numFlags = (NumericTokenFlags)NVar24.raw;
  (this_00->semi).rawLen = uVar25;
  (this_00->semi).info = pIVar5;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }